

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O1

void __thiscall
MMIntern::HttpClient::HttpClient(HttpClient *this,string *_url,string *_user,string *_password)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  
  (this->server)._M_dataplus._M_p = (pointer)&(this->server).field_2;
  pcVar1 = (_url->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + _url->_M_string_length);
  (this->user)._M_dataplus._M_p = (pointer)&(this->user).field_2;
  pcVar1 = (_user->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->user,pcVar1,pcVar1 + _user->_M_string_length);
  (this->password)._M_dataplus._M_p = (pointer)&(this->password).field_2;
  pcVar1 = (_password->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->password,pcVar1,pcVar1 + _password->_M_string_length);
  iVar2 = curl_global_init(3);
  if (iVar2 == 0) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"curl_global_init() failed: ",0x1b);
  pcVar3 = (char *)curl_easy_strerror(iVar2);
  poVar4 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/meteomatics[P]cpp-connector-api/include/Meteomatics_Internals.h"
                ,0xfb,
                "MMIntern::HttpClient::HttpClient(const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

MMIntern::HttpClient::HttpClient(const std::string& _url, const std::string& _user, const std::string& _password)
: server(_url)
, user(_user)
, password(_password)
{
    CURLcode res = curl_global_init(CURL_GLOBAL_ALL);
    if(res != CURLE_OK)
    {
        std::cout << "curl_global_init() failed: " << curl_easy_strerror(res) << std::endl;
        assert(false);
    }
}